

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall
QMdi::RegularTiler::rearrange(RegularTiler *this,QList<QWidget_*> *widgets,QRect *domain)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int index;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  LayoutDirection LVar10;
  int iVar11;
  int iVar12;
  LayoutDirection LVar13;
  LayoutDirection direction;
  qsizetype qVar14;
  int *piVar15;
  const_reference ppQVar16;
  QList<QWidget_*> *in_RSI;
  long in_FS_OFFSET;
  QWidget *widget;
  int y2;
  int x2;
  int x1;
  int col;
  int y1;
  int row;
  int i;
  int dy;
  int dx;
  int nspecial;
  int nrows;
  int ncols;
  int n;
  QRect newGeometry;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QWidget *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int iVar17;
  QWidget *in_stack_ffffffffffffff60;
  QWidget *this_00;
  int iVar18;
  int local_80;
  int local_18;
  int local_14 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x60bbd5);
  if (!bVar3) {
    qVar14 = QList<QWidget_*>::size(in_RSI);
    iVar4 = (int)qVar14;
    qSqrt<double>(3.13216720486531e-317);
    local_14[2] = qCeil<double>(3.13216967519354e-317);
    local_14[1] = 1;
    piVar15 = qMax<int>(local_14 + 2,local_14 + 1);
    iVar1 = *piVar15;
    if (iVar4 % iVar1 == 0) {
      index = iVar4 / iVar1;
    }
    else {
      index = iVar4 / iVar1 + 1;
    }
    local_18 = 1;
    local_14[0] = index;
    piVar15 = qMax<int>(local_14,&local_18);
    iVar2 = *piVar15;
    if (iVar4 % iVar1 == 0) {
      iVar4 = 0;
    }
    else {
      iVar4 = iVar1 - iVar4 % iVar1;
      in_stack_ffffffffffffff54 = iVar1;
    }
    iVar17 = iVar4;
    iVar5 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    iVar6 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    for (local_80 = 0; local_80 < iVar2; local_80 = local_80 + 1) {
      iVar7 = local_80 * (iVar6 / iVar2 + 1);
      for (iVar18 = 0; iVar18 < iVar1; iVar18 = iVar18 + 1) {
        if ((local_80 != 1) || (iVar4 <= iVar18)) {
          iVar8 = iVar18 * (iVar5 / iVar1 + 1);
          iVar9 = iVar8 + iVar5 / iVar1;
          LVar10 = iVar7 + iVar6 / iVar2;
          if ((local_80 == 0) && (iVar18 < iVar4)) {
            if (iVar2 == 2) {
              LVar10 = QRect::bottom((QRect *)0x60bda9);
            }
            else {
              LVar10 = LVar10 * 2 + RightToLeft;
            }
          }
          iVar12 = iVar9;
          if ((iVar18 == iVar1 + -1) &&
             (iVar11 = QRect::right((QRect *)0x60bdd0), in_stack_ffffffffffffff50 = iVar9,
             iVar9 != iVar11)) {
            iVar12 = QRect::right((QRect *)0x60bde4);
            in_stack_ffffffffffffff50 = iVar9;
          }
          direction = LVar10;
          if ((local_80 == iVar2 + -1) &&
             (LVar13 = QRect::bottom((QRect *)0x60be09), LVar10 != LVar13)) {
            direction = QRect::bottom((QRect *)0x60be1d);
          }
          bVar3 = sanityCheck((QList<QWidget_*> *)in_stack_ffffffffffffff60,index,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
          ;
          if (bVar3) {
            ppQVar16 = QList<QWidget_*>::at
                                 ((QList<QWidget_*> *)in_stack_ffffffffffffff40,
                                  CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
            this_00 = *ppQVar16;
            QPoint::QPoint((QPoint *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                           in_stack_ffffffffffffff38);
            QPoint::QPoint((QPoint *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                           in_stack_ffffffffffffff38);
            in_stack_ffffffffffffff40 = this_00;
            QRect::QRect((QRect *)this_00,(QPoint *)CONCAT44(index,iVar17),
                         (QPoint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
            in_stack_ffffffffffffff60 = in_stack_ffffffffffffff40;
            QWidget::layoutDirection((QWidget *)0x60beda);
            QStyle::visualRect(direction,(QRect *)in_stack_ffffffffffffff60,
                               (QRect *)CONCAT44(index,iVar17));
            QWidget::setGeometry((QWidget *)CONCAT44(iVar7,iVar18),(QRect *)CONCAT44(iVar8,iVar12));
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void RegularTiler::rearrange(QList<QWidget *> &widgets, const QRect &domain) const
{
    if (widgets.isEmpty())
        return;

    const int n = widgets.size();
    const int ncols = qMax(qCeil(qSqrt(qreal(n))), 1);
    const int nrows = qMax((n % ncols) ? (n / ncols + 1) : (n / ncols), 1);
    const int nspecial = (n % ncols) ? (ncols - n % ncols) : 0;
    const int dx = domain.width()  / ncols;
    const int dy = domain.height() / nrows;

    int i = 0;
    for (int row = 0; row < nrows; ++row) {
        const int y1 = int(row * (dy + 1));
        for (int col = 0; col < ncols; ++col) {
            if (row == 1 && col < nspecial)
                continue;
            const int x1 = int(col * (dx + 1));
            int x2 = int(x1 + dx);
            int y2 = int(y1 + dy);
            if (row == 0 && col < nspecial) {
                y2 *= 2;
                if (nrows != 2)
                    y2 += 1;
                else
                    y2 = domain.bottom();
            }
            if (col == ncols - 1 && x2 != domain.right())
                x2 = domain.right();
            if (row == nrows - 1 && y2 != domain.bottom())
                y2 = domain.bottom();
            if (!sanityCheck(widgets, i, "RegularTiler"))
                continue;
            QWidget *widget = widgets.at(i++);
            QRect newGeometry = QRect(QPoint(x1, y1), QPoint(x2, y2));
            widget->setGeometry(QStyle::visualRect(widget->layoutDirection(), domain, newGeometry));
        }
    }
}